

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_tEXt(ucvector *out,char *keyword,char *textstring)

{
  uint uVar1;
  uint extraout_EAX;
  uchar *in_RAX;
  uchar *puVar2;
  ulong __size;
  uchar *data;
  ulong uVar3;
  uchar uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar4 = *keyword;
  if (uVar4 == '\0') {
    uVar1 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    data = (uchar *)0x0;
    uVar6 = 0;
    uVar3 = 0;
  }
  else {
    uVar7 = 0xffffffffffffffff;
    uVar3 = 0;
    uVar6 = 0;
    data = (uchar *)0x0;
    do {
      uVar5 = uVar6 + 1;
      if (uVar3 < uVar5) {
        __size = uVar5 * 3 >> 1;
        if (uVar3 * 2 < uVar5) {
          __size = uVar5;
        }
        in_RAX = (uchar *)realloc(data,__size);
        bVar8 = in_RAX == (uchar *)0x0;
        if (!bVar8) {
          data = in_RAX;
          uVar3 = __size;
        }
      }
      else {
        bVar8 = false;
      }
      if (!bVar8) {
        data[uVar6] = uVar4;
        uVar6 = uVar5;
      }
      uVar4 = keyword[uVar7 + 2];
      uVar7 = uVar7 + 1;
    } while (uVar4 != '\0');
    uVar1 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),0x4e < uVar7);
  }
  if ((char)uVar1 != '\0') {
    return uVar1;
  }
  uVar7 = uVar6 + 1;
  if (uVar3 < uVar7) {
    uVar5 = uVar7 * 3 >> 1;
    if (uVar3 * 2 < uVar7) {
      uVar5 = uVar7;
    }
    puVar2 = (uchar *)realloc(data,uVar5);
    if (puVar2 == (uchar *)0x0) {
      bVar8 = true;
    }
    else {
      bVar8 = false;
      data = puVar2;
      uVar3 = uVar5;
    }
  }
  else {
    bVar8 = false;
  }
  if (!bVar8) {
    data[uVar6] = '\0';
    uVar6 = uVar7;
  }
  uVar4 = *textstring;
  while (uVar4 != '\0') {
    textstring = (char *)((uchar *)textstring + 1);
    uVar7 = uVar6 + 1;
    if (uVar3 < uVar7) {
      uVar5 = uVar7 * 3 >> 1;
      if (uVar3 * 2 < uVar7) {
        uVar5 = uVar7;
      }
      puVar2 = (uchar *)realloc(data,uVar5);
      if (puVar2 == (uchar *)0x0) {
        bVar8 = true;
      }
      else {
        bVar8 = false;
        data = puVar2;
        uVar3 = uVar5;
      }
    }
    else {
      bVar8 = false;
    }
    if (!bVar8) {
      data[uVar6] = uVar4;
      uVar6 = uVar7;
    }
    uVar4 = *textstring;
  }
  uVar1 = lodepng_chunk_create(&out->data,&out->size,(uint)uVar6,"tEXt",data);
  if (uVar1 == 0) {
    out->allocsize = out->size;
  }
  free(data);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_tEXt(ucvector* out, const char* keyword, const char* textstring)
{
  unsigned error = 0;
  size_t i;
  ucvector text;
  ucvector_init(&text);
  for(i = 0; keyword[i] != 0; i++) ucvector_push_back(&text, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&text, 0); /*0 termination char*/
  for(i = 0; textstring[i] != 0; i++) ucvector_push_back(&text, (unsigned char)textstring[i]);
  error = addChunk(out, "tEXt", text.data, text.size);
  ucvector_cleanup(&text);

  return error;
}